

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

bool __thiscall
QWidgetTextControl::setFocusToNextOrPreviousAnchor(QWidgetTextControl *this,bool next)

{
  QTextCursor *cursor;
  long lVar1;
  qreal qVar2;
  char cVar3;
  bool bVar4;
  MoveMode MVar5;
  QWidgetTextControlPrivate *d;
  long in_FS_OFFSET;
  QTextCursor newAnchor;
  undefined1 *local_80;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((*(byte *)(lVar1 + 0xb0) & 8) == 0) {
    cVar3 = '\0';
  }
  else {
    cursor = (QTextCursor *)(lVar1 + 0x88);
    local_78.w = -NAN;
    local_78.h = -NAN;
    local_78.xp = -NAN;
    local_78.yp = -NAN;
    selectionRect(&local_78,this,cursor);
    local_58.xp = 0.0;
    local_58.yp = (qreal)&local_78;
    QMetaObject::activate((QObject *)this,&staticMetaObject,7,(void **)&local_58);
    cVar3 = QTextCursor::hasSelection();
    if (cVar3 == '\0') {
      QTextCursor::QTextCursor((QTextCursor *)&local_58,*(QTextDocument **)(lVar1 + 0x78));
      qVar2 = *(qreal *)(lVar1 + 0x88);
      *(qreal *)(lVar1 + 0x88) = local_58.xp;
      local_58.xp = qVar2;
      QTextCursor::~QTextCursor((QTextCursor *)&local_58);
      MVar5 = 0xb;
      if (next) {
        MVar5 = KeepAnchor;
      }
      QTextCursor::movePosition((MoveOperation)cursor,MVar5,0);
    }
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_80);
    bVar4 = findNextPrevAnchor(this,cursor,next,(QTextCursor *)&local_80);
    if (bVar4) {
      QTextCursor::operator=(cursor,(QTextCursor *)&local_80);
      *(undefined1 *)(lVar1 + 0x90) = 1;
    }
    else {
      QTextCursor::clearSelection();
    }
    cVar3 = QTextCursor::hasSelection();
    if (cVar3 != '\0') {
      selectionRect(&local_58,this,(QTextCursor *)(*(long *)(this + 8) + 0x88));
      local_78.w = local_58.w;
      local_78.h = local_58.h;
      local_78.xp = local_58.xp;
      local_78.yp = local_58.yp;
      local_58.xp = 0.0;
      local_58.yp = (qreal)&local_78;
      QMetaObject::activate((QObject *)this,&staticMetaObject,7,(void **)&local_58);
      local_58.xp = 0.0;
      local_58.yp = (qreal)&local_78;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0xb,(void **)&local_58);
    }
    QTextCursor::~QTextCursor((QTextCursor *)&local_80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControl::setFocusToNextOrPreviousAnchor(bool next)
{
    Q_D(QWidgetTextControl);

    if (!(d->interactionFlags & Qt::LinksAccessibleByKeyboard))
        return false;

    QRectF crect = selectionRect();
    emit updateRequest(crect);

    // If we don't have a current anchor, we start from the start/end
    if (!d->cursor.hasSelection()) {
        d->cursor = QTextCursor(d->doc);
        if (next)
            d->cursor.movePosition(QTextCursor::Start);
        else
            d->cursor.movePosition(QTextCursor::End);
    }

    QTextCursor newAnchor;
    if (findNextPrevAnchor(d->cursor, next, newAnchor)) {
        d->cursor = newAnchor;
        d->cursorIsFocusIndicator = true;
    } else {
        d->cursor.clearSelection();
    }

    if (d->cursor.hasSelection()) {
        crect = selectionRect();
        emit updateRequest(crect);
        emit visibilityRequest(crect);
        return true;
    } else {
        return false;
    }
}